

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

void __thiscall icu_63::Hashtable::Hashtable(Hashtable *this,UBool ignoreKeyCase,UErrorCode *status)

{
  code *ctx;
  
  this->hash = (UHashtable *)0x0;
  ctx = uhash_hashCaselessUnicodeString_63;
  if (ignoreKeyCase == '\0') {
    ctx = uhash_hashUnicodeString_63;
  }
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

inline Hashtable::Hashtable(UBool ignoreKeyCase, UErrorCode& status)
 : hash(0)
{
    init(ignoreKeyCase ? uhash_hashCaselessUnicodeString
                        : uhash_hashUnicodeString,
            ignoreKeyCase ? uhash_compareCaselessUnicodeString
                        : uhash_compareUnicodeString,
            NULL,
            status);
}